

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

size_t pbrt::
       FindInterval<pbrt::BVHAggregate::emitLBVH(pbrt::BVHBuildNode*&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>const&,pbrt::MortonPrimitive*,int,int*,std::vector<pbrt::Primitive,std::allocator<pbrt::Primitive>>&,std::atomic<int>*,int)::__0>
                 (size_t sz,anon_class_16_2_d9d0e799 *pred)

{
  bool bVar1;
  size_t sVar2;
  anon_class_16_2_d9d0e799 *in_RSI;
  long in_RDI;
  bool predResult;
  size_t middle;
  size_t half;
  ssize_t first;
  ssize_t size;
  ulong local_48;
  long local_40;
  long local_20;
  ulong local_18;
  
  local_20 = 1;
  local_18 = in_RDI - 2;
  while (0 < (long)local_18) {
    local_48 = local_18 >> 1;
    bVar1 = BVHAggregate::emitLBVH::anon_class_16_2_d9d0e799::operator()
                      (in_RSI,(int)(local_20 + local_48));
    if (bVar1) {
      local_40 = local_20 + local_48 + 1;
    }
    else {
      local_40 = local_20;
    }
    local_20 = local_40;
    if (bVar1) {
      local_48 = local_18 - (local_48 + 1);
    }
    local_18 = local_48;
  }
  sVar2 = Clamp<long,int,unsigned_long>(local_20 + -1,0,in_RDI - 2);
  return sVar2;
}

Assistant:

PBRT_CPU_GPU inline size_t FindInterval(size_t sz, const Predicate &pred) {
    using ssize_t = std::make_signed_t<size_t>;
    ssize_t size = (ssize_t)sz - 2, first = 1;
    while (size > 0) {
        // Evaluate predicate at midpoint and update _first_ and _size_
        size_t half = (size_t)size >> 1, middle = first + half;
        bool predResult = pred(middle);
        first = predResult ? middle + 1 : first;
        size = predResult ? size - (half + 1) : half;
    }
    return (size_t)Clamp((ssize_t)first - 1, 0, sz - 2);
}